

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

int __thiscall Bitmap::drawText(Bitmap *this,int32_t x,int32_t y,char *text)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int32_t pixel;
  uint uVar4;
  int32_t pixel_00;
  int iVar5;
  GlyphIterator *this_00;
  
  if (this->font == (GFXfont *)0x0) {
    iVar5 = -1;
  }
  else {
    iVar5 = 0;
    while (bVar1 = *text, bVar1 != 0) {
      text = (char *)((byte *)text + 1);
      iVar3 = Utf8Decoder::decode(&this->utf8,(uint)bVar1);
      if (0 < iVar3) {
        pixel = getPixelIndex(this,x,y);
        uVar4 = GlyphIterator::init(this->glyphIterator,(EVP_PKEY_CTX *)this->font);
        while (this_00 = this->glyphIterator, (uVar4 & 1) != 0) {
          pixel_00 = getPixelIndex(this,pixel,this_00->xOffset,this_00->yOffset);
          if (-1 < pixel_00) {
            setPixelValue(this,pixel_00,this_00->value);
            this_00 = this->glyphIterator;
          }
          bVar2 = GlyphIterator::next(this_00);
          uVar4 = (uint)bVar2;
        }
        x = x + this_00->xAdvance;
        iVar5 = iVar5 + this_00->xAdvance;
      }
    }
  }
  return iVar5;
}

Assistant:

int Bitmap::drawText(const int32_t x, const int32_t y, const char * text)
{
   int32_t cursor;
   int32_t pixel;
   int32_t width;
   int character;
   bool status;

   if (this->font == nullptr)
   {
      return -1;
   }

   width = 0;
   cursor = x;
   while ((character = (uint8_t)(*text++)) != 0)
   {
      //handle utf8 characters
      character = utf8.decode(character);
      //only for ASCII chars in range 1 ..127 and the suported UTF8 onces. Others will be skipped!
      if (character > 0)
      {
         //draw pixel for pixel of character
         const int32_t origin = getPixelIndex(cursor, y);
         status = glyphIterator->init(this->font, character);
         while (status)
         {
            //calculate pixel index to be set to the respective value
            pixel = getPixelIndex(origin, glyphIterator->xOffset, glyphIterator->yOffset);
            if (pixel >= 0)
            {
               //set pixel to its value
               setPixelValue(pixel, glyphIterator->value);
            }
            //select next pixel
            status = glyphIterator->next();
         }

         //increment cursor
         cursor += glyphIterator->xAdvance;
         width += glyphIterator->xAdvance;
      }
   }

   return width;
}